

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O0

bool __thiscall FlatFileSeq::Flush(FlatFileSeq *this,FlatFilePos *pos,bool finalize)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  FILE *__stream;
  byte in_DL;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  FILE *file;
  Level in_stack_000000c0;
  char (*in_stack_000000d0) [6];
  int *in_stack_000000d8;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff30;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffffa7;
  FlatFilePos *in_stack_ffffffffffffffa8;
  FlatFileSeq *in_stack_ffffffffffffffb0;
  ConstevalFormatString<2U> in_stack_ffffffffffffffc8;
  string_view in_stack_ffffffffffffffd0;
  string_view in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  FlatFilePos::FlatFilePos
            ((FlatFilePos *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0,0xf36b4e
            );
  __stream = (FILE *)Open(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          (bool)in_stack_ffffffffffffffa7);
  if (__stream == (FILE *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    LogPrintFormatInternal<char[6],int>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffff8c,in_RDI,
               in_stack_000000c0,in_stack_ffffffffffffffc8,in_stack_000000d0,in_stack_000000d8);
    bVar3 = false;
  }
  else {
    if ((bVar2 & 1) != 0) {
      bVar3 = TruncateFile((FILE *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
      if (!bVar3) {
        fclose(__stream);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        LogPrintFormatInternal<char[6],int>
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffff8c,
                   in_RDI,in_stack_000000c0,in_stack_ffffffffffffffc8,in_stack_000000d0,
                   in_stack_000000d8);
        bVar3 = false;
        goto LAB_00f36d93;
      }
    }
    bVar3 = FileCommit((FILE *)CONCAT17(bVar2,in_stack_ffffffffffffff70));
    if (bVar3) {
      DirectoryCommit((path *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      fclose(__stream);
      bVar3 = true;
    }
    else {
      fclose(__stream);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      LogPrintFormatInternal<char[6],int>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffff8c,
                 in_RDI,in_stack_000000c0,in_stack_ffffffffffffffc8,in_stack_000000d0,
                 in_stack_000000d8);
      bVar3 = false;
    }
  }
LAB_00f36d93:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatFileSeq::Flush(const FlatFilePos& pos, bool finalize) const
{
    FILE* file = Open(FlatFilePos(pos.nFile, 0)); // Avoid fseek to nPos
    if (!file) {
        LogError("%s: failed to open file %d\n", __func__, pos.nFile);
        return false;
    }
    if (finalize && !TruncateFile(file, pos.nPos)) {
        fclose(file);
        LogError("%s: failed to truncate file %d\n", __func__, pos.nFile);
        return false;
    }
    if (!FileCommit(file)) {
        fclose(file);
        LogError("%s: failed to commit file %d\n", __func__, pos.nFile);
        return false;
    }
    DirectoryCommit(m_dir);

    fclose(file);
    return true;
}